

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.h
# Opt level: O2

void __thiscall CGL::AppConfig::AppConfig(AppConfig *this,AppConfig *param_1)

{
  double dVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  HDRImageBuffer *pHVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  undefined8 uVar12;
  
  sVar2 = param_1->pathtracer_ns_aa;
  sVar3 = param_1->pathtracer_max_ray_depth;
  sVar4 = param_1->pathtracer_ns_area_light;
  sVar5 = param_1->pathtracer_ns_diff;
  sVar6 = param_1->pathtracer_ns_glsy;
  sVar7 = param_1->pathtracer_ns_refr;
  sVar8 = param_1->pathtracer_num_threads;
  pHVar9 = param_1->pathtracer_envmap;
  uVar10 = *(undefined8 *)((long)&param_1->pathtracer_envmap + 1);
  uVar11 = *(undefined8 *)((long)&param_1->pathtracer_max_tolerance + 1);
  uVar12 = *(undefined8 *)((long)&param_1->pathtracer_samples_per_patch + 1);
  *(undefined8 *)((long)&this->pathtracer_num_threads + 1) =
       *(undefined8 *)((long)&param_1->pathtracer_num_threads + 1);
  *(undefined8 *)((long)&this->pathtracer_envmap + 1) = uVar10;
  *(undefined8 *)((long)&this->pathtracer_max_tolerance + 1) = uVar11;
  *(undefined8 *)((long)&this->pathtracer_samples_per_patch + 1) = uVar12;
  this->pathtracer_ns_glsy = sVar6;
  this->pathtracer_ns_refr = sVar7;
  this->pathtracer_num_threads = sVar8;
  this->pathtracer_envmap = pHVar9;
  this->pathtracer_ns_aa = sVar2;
  this->pathtracer_max_ray_depth = sVar3;
  this->pathtracer_ns_area_light = sVar4;
  this->pathtracer_ns_diff = sVar5;
  std::__cxx11::string::string
            ((string *)&this->pathtracer_filename,(string *)&param_1->pathtracer_filename);
  dVar1 = param_1->pathtracer_focalDistance;
  this->pathtracer_lensRadius = param_1->pathtracer_lensRadius;
  this->pathtracer_focalDistance = dVar1;
  std::__cxx11::string::string
            ((string *)&this->aperture_filename,(string *)&param_1->aperture_filename);
  dVar1 = param_1->pathtracer_lens_flare_radius;
  this->pathtracer_lens_flare_intensity = param_1->pathtracer_lens_flare_intensity;
  this->pathtracer_lens_flare_radius = dVar1;
  std::__cxx11::string::string
            ((string *)&this->ghost_aperture_filename,(string *)&param_1->ghost_aperture_filename);
  return;
}

Assistant:

AppConfig () {

    pathtracer_ns_aa = 1;
    pathtracer_max_ray_depth = 1;
    pathtracer_ns_area_light = 1;

    pathtracer_ns_diff = 1;
    pathtracer_ns_glsy = 1;
    pathtracer_ns_refr = 1;

    pathtracer_num_threads = 1;
    pathtracer_envmap = NULL;

    pathtracer_samples_per_patch = 32;
    pathtracer_max_tolerance = 0.05f;
    pathtracer_direct_hemisphere_sample = false;

    pathtracer_filename = "";
    pathtracer_lensRadius = 0.0;
    pathtracer_focalDistance = 4.7;

    // Begin Lens Flare implementation
    aperture_filename = "";
    pathtracer_lens_flare_radius = 25.0;
    pathtracer_lens_flare_intensity = 1;
		ghost_aperture_filename = "";
  }